

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPo.c
# Opt level: O1

int Gia_PolynHandleOne(Hsh_VecMan_t *pHashC,Hsh_VecMan_t *pHashM,Vec_Int_t *vCoefs,
                      Vec_Wec_t *vLit2Mono,Vec_Int_t *vTempC,Vec_Int_t *vTempM,int iMono,int iLitOld
                      ,int iLitNew0,int iLitNew1)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int *piVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  
  if ((-1 < iMono) && (iMono < vCoefs->nSize)) {
    iVar3 = vCoefs->pArray[(uint)iMono];
    if ((-1 < (long)iVar3) && (iVar3 < pHashC->vMap->nSize)) {
      iVar3 = pHashC->vMap->pArray[iVar3];
      if ((-1 < (long)iVar3) && (iVar3 < pHashC->vData->nSize)) {
        piVar6 = pHashC->vData->pArray + (long)iVar3 + 2;
        iVar3 = piVar6[-2];
        (pHashC->vTemp).nCap = iVar3;
        (pHashC->vTemp).nSize = iVar3;
        (pHashC->vTemp).pArray = piVar6;
        if (pHashM->vMap->nSize <= iMono) goto LAB_00663ff7;
        iVar3 = pHashM->vMap->pArray[(uint)iMono];
        if ((-1 < (long)iVar3) && (iVar3 < pHashM->vData->nSize)) {
          piVar6 = pHashM->vData->pArray + iVar3;
          iVar3 = *piVar6;
          (pHashM->vTemp).nCap = iVar3;
          (pHashM->vTemp).nSize = iVar3;
          (pHashM->vTemp).pArray = piVar6 + 2;
          vTempM->nSize = 0;
          if (0 < (pHashM->vTemp).nSize) {
            lVar9 = 0;
            do {
              Vec_IntPush(vTempM,(pHashM->vTemp).pArray[lVar9]);
              lVar9 = lVar9 + 1;
            } while (lVar9 < (pHashM->vTemp).nSize);
          }
          uVar1 = vTempM->nSize;
          uVar5 = 0;
          bVar10 = 0 < (int)uVar1;
          if (0 < (int)uVar1) {
            bVar10 = true;
            if (*vTempM->pArray != iLitOld) {
              uVar8 = 0;
              do {
                if ((ulong)uVar1 - 1 == uVar8) {
                  bVar10 = false;
                  uVar5 = (ulong)uVar1;
                  goto LAB_00663ea8;
                }
                uVar5 = uVar8 + 1;
                lVar9 = uVar8 + 1;
                uVar8 = uVar5;
              } while (vTempM->pArray[lVar9] != iLitOld);
              bVar10 = uVar5 < uVar1;
            }
          }
LAB_00663ea8:
          uVar4 = (uint)uVar5;
          if (uVar4 != uVar1) {
            if (!bVar10) {
              __assert_fail("i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
            }
            uVar7 = uVar1;
            if ((int)(uVar4 + 1) < (int)uVar1) {
              piVar2 = vTempM->pArray;
              piVar6 = piVar2 + (uVar4 + 1);
              uVar5 = uVar5 & 0xffffffff;
              do {
                iVar3 = (int)uVar5;
                piVar2[uVar5] = *piVar6;
                uVar7 = vTempM->nSize;
                piVar6 = piVar6 + 1;
                uVar5 = (ulong)(iVar3 + 1);
              } while (iVar3 + 2 < (int)uVar7);
            }
            vTempM->nSize = uVar7 - 1;
            if (uVar4 != uVar1) {
              if ((iLitNew1 & iLitNew0) == 0xffffffff) {
                vTempC->nSize = 0;
                if (0 < (pHashC->vTemp).nSize) {
                  lVar9 = 0;
                  do {
                    Vec_IntPushOrderAbs(vTempC,(pHashC->vTemp).pArray[lVar9]);
                    lVar9 = lVar9 + 1;
                  } while (lVar9 < (pHashC->vTemp).nSize);
                }
              }
              else {
                if (iLitNew0 < 0 || iLitNew1 != -1) {
                  if ((iLitNew1 | iLitNew0) < 0) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecPo.c"
                                  ,0x1fc,
                                  "int Gia_PolynHandleOne(Hsh_VecMan_t *, Hsh_VecMan_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                                 );
                  }
                  vTempC->nSize = 0;
                  if (0 < (pHashC->vTemp).nSize) {
                    lVar9 = 0;
                    do {
                      Vec_IntPushOrderAbs(vTempC,(pHashC->vTemp).pArray[lVar9]);
                      lVar9 = lVar9 + 1;
                    } while (lVar9 < (pHashC->vTemp).nSize);
                  }
                  Vec_IntPushUniqueOrder(vTempM,iLitNew0);
                }
                else {
                  vTempC->nSize = 0;
                  iLitNew1 = iLitNew0;
                  if (0 < (pHashC->vTemp).nSize) {
                    lVar9 = 0;
                    do {
                      Vec_IntPushOrderAbs(vTempC,-(pHashC->vTemp).pArray[lVar9]);
                      lVar9 = lVar9 + 1;
                    } while (lVar9 < (pHashC->vTemp).nSize);
                  }
                }
                Vec_IntPushUniqueOrder(vTempM,iLitNew1);
              }
              iVar3 = Gia_PolynBuildAdd(pHashC,pHashM,vCoefs,vLit2Mono,vTempC,vTempM);
              return iVar3;
            }
          }
          __assert_fail("status",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecPo.c"
                        ,0x1ed,
                        "int Gia_PolynHandleOne(Hsh_VecMan_t *, Hsh_VecMan_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                       );
        }
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
  }
LAB_00663ff7:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int Gia_PolynHandleOne( Hsh_VecMan_t * pHashC, Hsh_VecMan_t * pHashM, Vec_Int_t * vCoefs, 
                                      Vec_Wec_t * vLit2Mono, Vec_Int_t * vTempC, Vec_Int_t * vTempM, 
                                      int iMono, int iLitOld, int iLitNew0, int iLitNew1 )
{
    int status, iConst = Vec_IntEntry( vCoefs, iMono );
    Vec_Int_t * vArrayC = Hsh_VecReadEntry( pHashC, iConst );
    Vec_Int_t * vArrayM = Hsh_VecReadEntry( pHashM, iMono );
    // create new monomial
    Vec_IntClear( vTempM );
    Vec_IntAppend( vTempM, vArrayM );
    status = Vec_IntRemove( vTempM, iLitOld );
    assert( status );
    // create new monomial
    if ( iLitNew0 == -1 && iLitNew1 == -1 )     // no new lit - the same const
        Vec_IntAppendMinusAbs( vTempC, vArrayC, 0 );
    else if ( iLitNew0 > -1 && iLitNew1 == -1 ) // one new lit - opposite const
    {
        Vec_IntAppendMinusAbs( vTempC, vArrayC, 1 );
        Vec_IntPushUniqueOrder( vTempM, iLitNew0 );
    }
    else if ( iLitNew0 > -1 && iLitNew1 > -1 )  // both new lit - the same const
    {
        Vec_IntAppendMinusAbs( vTempC, vArrayC, 0 );
        Vec_IntPushUniqueOrder( vTempM, iLitNew0 );
        Vec_IntPushUniqueOrder( vTempM, iLitNew1 );
    }
    else assert( 0 );
    return Gia_PolynBuildAdd( pHashC, pHashM, vCoefs, vLit2Mono, vTempC, vTempM );
}